

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.cc
# Opt level: O1

bool __thiscall AVO::Vector2::operator!=(Vector2 *this,Vector2 *other)

{
  bool bVar1;
  
  bVar1 = true;
  if (ABS(this->x_ - other->x_) < 1e-05) {
    bVar1 = 1e-05 <= ABS(this->y_ - other->y_);
  }
  return bVar1;
}

Assistant:

bool Vector2::operator==(const Vector2 &other) const {
  return std::fabs(x_ - other.x_) < AVO_EPSILON &&
         std::fabs(y_ - other.y_) < AVO_EPSILON;
}